

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Itemset.cc
# Opt level: O2

void __thiscall Itemset::print_seq(Itemset *this,ostream *seqstrm,int itempl)

{
  uint index;
  Array *this_00;
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  long lVar4;
  uint index_00;
  int iVar5;
  
  this_00 = (this->theItemset).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar5 = this_00->theSize;
  iVar1 = Array::operator[](this_00,0);
  poVar3 = (ostream *)std::ostream::operator<<(seqstrm,iVar1);
  std::operator<<(poVar3," ");
  index = iVar5 - 1;
  iVar5 = iVar5 + -2;
  index_00 = 1;
  while( true ) {
    uVar2 = 1 << ((byte)iVar5 & 0x1f) & itempl;
    if ((int)index <= (int)index_00) break;
    if (uVar2 != 0) {
      std::operator<<(seqstrm,"-> ");
    }
    iVar1 = Array::operator[]((this->theItemset).
                              super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr,index_00)
    ;
    poVar3 = (ostream *)std::ostream::operator<<(seqstrm,iVar1);
    std::operator<<(poVar3," ");
    index_00 = index_00 + 1;
    iVar5 = iVar5 + -1;
  }
  if (uVar2 != 0) {
    std::operator<<(seqstrm,"-> ");
  }
  iVar5 = Array::operator[]((this->theItemset).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,index);
  poVar3 = (ostream *)std::ostream::operator<<(seqstrm,iVar5);
  std::operator<<(poVar3," ");
  poVar3 = std::operator<<(seqstrm,"-- ");
  std::ostream::operator<<(poVar3,this->theSupport);
  lVar4 = 0;
  while( true ) {
    iVar5 = this->num_class;
    poVar3 = std::operator<<(seqstrm," ");
    if (iVar5 <= lVar4) break;
    std::ostream::operator<<
              (poVar3,(this->clsSup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar4]);
    lVar4 = lVar4 + 1;
  }
  std::endl<char,std::char_traits<char>>(seqstrm);
  return;
}

Assistant:

void Itemset::print_seq(ostream& seqstrm, int itempl) {
    int i;
    int sz = size();
    seqstrm << (*theItemset)[0] << " ";
    for (i = 1; i < sz - 1; i++) {
        if (GETBIT(itempl, sz - 1 - i))
            seqstrm << "-> ";
        seqstrm << (*theItemset)[i] << " ";
    }
    if (GETBIT(itempl, sz - 1 - i))
        seqstrm << "-> ";
    seqstrm << (*theItemset)[sz - 1] << " ";
    seqstrm << "-- " << theSupport;
    for (i = 0; i < num_class; i++)
        seqstrm << " " << clsSup[i];
    seqstrm << " ";
//    if (do_print) print_idlist();
    seqstrm << endl;
}